

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void parserDoubleLinkSelect(Parse *pParse,Select *p)

{
  byte *pbVar1;
  int iVar2;
  Select *pSVar3;
  int iVar4;
  Select *pSVar5;
  Select *pSVar6;
  
  if (p->pPrior != (Select *)0x0) {
    iVar4 = 0;
    if (p != (Select *)0x0) {
      pSVar3 = p;
      pSVar6 = (Select *)0x0;
      do {
        pSVar5 = pSVar3;
        pSVar5->pNext = pSVar6;
        pbVar1 = (byte *)((long)&pSVar5->selFlags + 1);
        *pbVar1 = *pbVar1 | 1;
        iVar4 = iVar4 + 1;
        pSVar3 = pSVar5->pPrior;
        pSVar6 = pSVar5;
      } while (pSVar5->pPrior != (Select *)0x0);
    }
    if ((p->selFlags & 0x400) == 0) {
      iVar2 = pParse->db->aLimit[4];
      if (iVar2 < iVar4 && 0 < iVar2) {
        sqlite3ErrorMsg(pParse,"too many terms in compound SELECT");
        return;
      }
    }
  }
  return;
}

Assistant:

static void parserDoubleLinkSelect(Parse *pParse, Select *p){
    if( p->pPrior ){
      Select *pNext = 0, *pLoop;
      int mxSelect, cnt = 0;
      for(pLoop=p; pLoop; pNext=pLoop, pLoop=pLoop->pPrior, cnt++){
        pLoop->pNext = pNext;
        pLoop->selFlags |= SF_Compound;
      }
      if( (p->selFlags & SF_MultiValue)==0 && 
        (mxSelect = pParse->db->aLimit[SQLITE_LIMIT_COMPOUND_SELECT])>0 &&
        cnt>mxSelect
      ){
        sqlite3ErrorMsg(pParse, "too many terms in compound SELECT");
      }
    }
  }